

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2closest_edge_query_base.h
# Opt level: O3

void __thiscall
S2ClosestEdgeQueryBase<S2MaxDistance>::ProcessEdges
          (S2ClosestEdgeQueryBase<S2MaxDistance> *this,QueueEntry *entry)

{
  compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *this_00;
  int iVar1;
  uint uVar2;
  const_reference pvVar3;
  undefined4 extraout_var;
  anon_union_8_2_2d159a09_for_S2ClippedShape_3 *paVar4;
  size_type_conflict n;
  long lVar5;
  ulong uVar6;
  
  this_00 = (compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *)entry->index_cell
  ;
  if (((undefined1  [16])*this_00 & (undefined1  [16])0xffffff) != (undefined1  [16])0x0) {
    n = 0;
    do {
      pvVar3 = gtl::compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>::operator[]
                         (this_00,n);
      iVar1 = (*this->index_->_vptr_S2ShapeIndex[3])(this->index_,(ulong)(uint)pvVar3->shape_id_);
      uVar2 = *(uint *)&pvVar3->field_0x4;
      if (1 < uVar2) {
        lVar5 = 0;
        uVar6 = 0;
        do {
          paVar4 = &pvVar3->field_3;
          if (5 < uVar2) {
            paVar4 = (anon_union_8_2_2d159a09_for_S2ClippedShape_3 *)(pvVar3->field_3).edges_;
          }
          MaybeAddResult(this,(S2Shape *)CONCAT44(extraout_var,iVar1),*(int *)((long)paVar4 + lVar5)
                        );
          uVar6 = uVar6 + 1;
          uVar2 = *(uint *)&pvVar3->field_0x4;
          lVar5 = lVar5 + 4;
        } while (uVar6 < uVar2 >> 1);
      }
      n = n + 1;
    } while (n < (*(uint *)this_00 & 0xffffff));
  }
  return;
}

Assistant:

void S2ClosestEdgeQueryBase<Distance>::ProcessEdges(const QueueEntry& entry) {
  const S2ShapeIndexCell* index_cell = entry.index_cell;
  for (int s = 0; s < index_cell->num_clipped(); ++s) {
    const S2ClippedShape& clipped = index_cell->clipped(s);
    const S2Shape* shape = index_->shape(clipped.shape_id());
    for (int j = 0; j < clipped.num_edges(); ++j) {
      MaybeAddResult(*shape, clipped.edge(j));
    }
  }
}